

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall QMdiAreaPrivate::_q_moveTab(QMdiAreaPrivate *this,int from,int to)

{
  long lVar1;
  int iVar2;
  qsizetype qVar3;
  undefined4 in_EDX;
  undefined4 in_ESI;
  QListSpecialMethodsBase<QPointer<QMdiSubWindow>_> *in_RDI;
  long in_FS_OFFSET;
  int index;
  int indexToActiveWindow;
  QPointer<QMdiSubWindow> *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  QListSpecialMethodsBase<QPointer<QMdiSubWindow>_> *mdiChild;
  undefined4 in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  mdiChild = in_RDI;
  QList<QPointer<QMdiSubWindow>_>::move
            ((QList<QPointer<QMdiSubWindow>_> *)CONCAT44(in_ESI,in_EDX),
             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),(qsizetype)in_RDI);
  qVar3 = QListSpecialMethodsBase<QPointer<QMdiSubWindow>>::indexOf<QPointer<QMdiSubWindow>>
                    (in_RDI,in_stack_ffffffffffffffc8,0x60f002);
  iVar2 = (int)qVar3;
  if (iVar2 != -1) {
    qVar3 = QListSpecialMethodsBase<int>::indexOf<int>
                      ((QListSpecialMethodsBase<int> *)in_RDI,(int *)in_stack_ffffffffffffffc8,
                       0x60f027);
    if ((int)qVar3 != 0) {
      QList<int>::move((QList<int> *)CONCAT44(in_ESI,in_EDX),
                       CONCAT44((int)qVar3,in_stack_ffffffffffffffd8),(qsizetype)in_RDI);
      ::QPointer::operator_cast_to_QMdiSubWindow_((QPointer<QMdiSubWindow> *)0x60f05d);
      internalRaise((QMdiAreaPrivate *)CONCAT44(iVar2,in_stack_fffffffffffffff0),
                    (QMdiSubWindow *)mdiChild);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiAreaPrivate::_q_moveTab(int from, int to)
{
#if !QT_CONFIG(tabbar)
    Q_UNUSED(from);
    Q_UNUSED(to);
#else
    childWindows.move(from, to);

    // Put the active window in front to update activation order.
    const int indexToActiveWindow = childWindows.indexOf(active);
    if (indexToActiveWindow != -1) {
        const int index = indicesToActivatedChildren.indexOf(indexToActiveWindow);
        Q_ASSERT(index != -1);
        if (index != 0) { // if it's not in front
            indicesToActivatedChildren.move(index, 0);
            internalRaise(active);
        }
    }
#endif // QT_CONFIG(tabbar)
}